

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateDispatchLoaderDynamicCommandAssignment
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *commandName,
          string *aliasName,string *firstArg)

{
  char *pcVar1;
  bool bVar2;
  __type_conflict _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_45;
  allocator<char> local_31;
  string *local_30;
  string *firstArg_local;
  string *aliasName_local;
  string *commandName_local;
  VulkanHppGenerator *this_local;
  string *str;
  
  local_30 = firstArg;
  firstArg_local = aliasName;
  aliasName_local = commandName;
  commandName_local = &this->m_api;
  this_local = (VulkanHppGenerator *)__return_storage_ptr__;
  bVar2 = std::operator==(commandName,"vkGetInstanceProcAddr");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    local_45 = 0;
    std::operator+(&local_168,"      ",aliasName_local);
    std::operator+(&local_148,&local_168," = PFN_");
    std::operator+(&local_128,&local_148,aliasName_local);
    std::operator+(&local_108,&local_128,"( vkGet");
    bVar2 = std::operator==(local_30,"device");
    pcVar1 = "VkInstance";
    if (bVar2) {
      pcVar1 = "VkDevice";
    }
    std::operator+(&local_e8,&local_108,pcVar1 + 2);
    std::operator+(&local_c8,&local_e8,"ProcAddr( ");
    std::operator+(&local_a8,&local_c8,local_30);
    std::operator+(&local_88,&local_a8,", \"");
    std::operator+(&local_68,&local_88,aliasName_local);
    std::operator+(__return_storage_ptr__,&local_68,"\" ) );\n");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    _Var3 = std::operator==(aliasName_local,firstArg_local);
    if (((_Var3 ^ 0xffU) & 1) != 0) {
      std::operator+(&local_228,"      if ( !",firstArg_local);
      std::operator+(&local_208,&local_228," ) ");
      std::operator+(&local_1e8,&local_208,firstArg_local);
      std::operator+(&local_1c8,&local_1e8," = ");
      std::operator+(&local_1a8,&local_1c8,aliasName_local);
      std::operator+(&local_188,&local_1a8,";\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateDispatchLoaderDynamicCommandAssignment( std::string const & commandName,
                                                                                std::string const & aliasName,
                                                                                std::string const & firstArg ) const
{
  if ( commandName == "vkGetInstanceProcAddr" )
  {
    // Don't overwite vkGetInstanceProcAddr with NULL.
    return "";
  }
  std::string str = "      " + commandName + " = PFN_" + commandName + "( vkGet" + ( ( firstArg == "device" ) ? "Device" : "Instance" ) + "ProcAddr( " +
                    firstArg + ", \"" + commandName + "\" ) );\n";
  // if this is an alias'ed function, use it as a fallback for the original one
  if ( commandName != aliasName )
  {
    str += "      if ( !" + aliasName + " ) " + aliasName + " = " + commandName + ";\n";
  }
  return str;
}